

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncFirstLineInput(xmlParserInputBufferPtr input,int len)

{
  xmlBufPtr buf_00;
  xmlBufPtr buf_01;
  xmlCharEncodingHandler *handler;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  xmlChar *out;
  xmlChar *in;
  byte *pbVar5;
  ulong uVar6;
  int in_R9D;
  ulong uVar7;
  int iVar8;
  int c_out;
  int c_in;
  char buf [50];
  int local_70;
  int local_6c;
  char local_68 [49];
  undefined1 local_37;
  
  iVar8 = -1;
  iVar1 = -1;
  if ((((input != (xmlParserInputBufferPtr)0x0) &&
       (iVar1 = iVar8, input->encoder != (xmlCharEncodingHandlerPtr)0x0)) &&
      (buf_00 = input->buffer, buf_00 != (xmlBufPtr)0x0)) &&
     (buf_01 = input->raw, buf_01 != (xmlBufPtr)0x0)) {
    sVar2 = xmlBufUse(buf_01);
    if (sVar2 == 0) {
      iVar1 = 0;
    }
    else {
      sVar3 = xmlBufAvail(buf_00);
      uVar4 = sVar3 - 1;
      uVar7 = 0xb4;
      if (-1 < len) {
        uVar7 = (ulong)(uint)len;
      }
      if (sVar2 < uVar7) {
        uVar7 = sVar2;
      }
      if (uVar4 <= uVar7 * 2) {
        xmlBufGrow(buf_00,(int)(uVar7 * 2));
        sVar2 = xmlBufAvail(buf_00);
        uVar4 = sVar2 - 1;
      }
      uVar6 = 0x168;
      if (uVar4 < 0x168) {
        uVar6 = uVar4;
      }
      local_6c = (int)uVar7;
      local_70 = (int)uVar6;
      handler = input->encoder;
      out = xmlBufEnd(buf_00);
      in = xmlBufContent(buf_01);
      iVar1 = xmlEncInputChunk(handler,out,&local_70,in,&local_6c,in_R9D);
      xmlBufShrink(buf_01,(long)local_6c);
      xmlBufAddLen(buf_00,(long)local_70);
      iVar8 = -3;
      if (iVar1 != -1) {
        iVar8 = iVar1;
      }
      if (iVar8 == -2) {
        pbVar5 = xmlBufContent(buf_01);
        snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar5,(ulong)pbVar5[1],
                 (ulong)pbVar5[2],(uint)pbVar5[3]);
        local_37 = 0;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,local_68,(char *)0x0,
                        (char *)0x0,0,0,"input conversion failed due to input error, bytes %s\n",
                        local_68);
      }
      iVar1 = 0;
      if (iVar8 != -3) {
        iVar1 = iVar8;
      }
      if (local_70 != 0) {
        iVar1 = local_70;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlCharEncFirstLineInput(xmlParserInputBufferPtr input, int len)
{
    int ret;
    size_t written;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((input == NULL) || (input->encoder == NULL) ||
        (input->buffer == NULL) || (input->raw == NULL))
        return (-1);
    out = input->buffer;
    in = input->raw;

    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (0);
    written = xmlBufAvail(out) - 1; /* count '\0' */
    /*
     * echo '<?xml version="1.0" encoding="UCS4"?>' | wc -c => 38
     * 45 chars should be sufficient to reach the end of the encoding
     * declaration without going too far inside the document content.
     * on UTF-16 this means 90bytes, on UCS4 this means 180
     * The actual value depending on guessed encoding is passed as @len
     * if provided
     */
    if (len >= 0) {
        if (toconv > (unsigned int) len)
            toconv = len;
    } else {
        if (toconv > 180)
            toconv = 180;
    }
    if (toconv * 2 >= written) {
        xmlBufGrow(out, toconv * 2);
        written = xmlBufAvail(out) - 1;
    }
    if (written > 360)
        written = 360;

    c_in = toconv;
    c_out = written;
    ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                           xmlBufContent(in), &c_in, 0);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    if (ret == -1)
        ret = -3;

    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                            "converted %d bytes to %d bytes of input\n",
                            c_in, c_out);
#endif
            break;
        case -1:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                         "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -3:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                        "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -2: {
            char buf[50];
            const xmlChar *content = xmlBufContent(in);

	    snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
		     content[0], content[1],
		     content[2], content[3]);
	    buf[49] = 0;
	    xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "input conversion failed due to input error, bytes %s\n",
		           buf);
        }
    }
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3) ret = 0;
    if (ret == -1) ret = 0;
    return(c_out ? c_out : ret);
}